

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_state.cpp
# Opt level: O1

void __thiscall
spvtools::val::ValidationState_t::RegisterDebugInstruction
          (ValidationState_t *this,Instruction *inst)

{
  uint16_t uVar1;
  uint uVar2;
  mapped_type *pmVar3;
  long *plVar4;
  string str;
  uint local_8c;
  string local_88;
  long *local_68 [2];
  long local_58 [2];
  long *local_48 [2];
  long local_38 [2];
  
  uVar1 = (inst->inst_).opcode;
  if (uVar1 == 6) {
    uVar2 = Instruction::GetOperandAs<unsigned_int>(inst,0);
    Instruction::GetOperandAs<std::__cxx11::string>(&local_88,inst,2);
    local_68[0] = local_58;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_68,local_88._M_dataplus._M_p,
               local_88._M_dataplus._M_p + local_88._M_string_length);
    local_8c = uVar2;
    pmVar3 = std::__detail::
             _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&this->operand_names_,&local_8c);
    std::__cxx11::string::_M_assign((string *)pmVar3);
    plVar4 = local_68[0];
    if (local_68[0] == local_58) goto LAB_0021205a;
  }
  else {
    if (uVar1 != 5) {
      return;
    }
    uVar2 = Instruction::GetOperandAs<unsigned_int>(inst,0);
    Instruction::GetOperandAs<std::__cxx11::string>(&local_88,inst,1);
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_48,local_88._M_dataplus._M_p,
               local_88._M_dataplus._M_p + local_88._M_string_length);
    local_8c = uVar2;
    pmVar3 = std::__detail::
             _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&this->operand_names_,&local_8c);
    std::__cxx11::string::_M_assign((string *)pmVar3);
    local_58[0] = local_38[0];
    plVar4 = local_48[0];
    if (local_48[0] == local_38) goto LAB_0021205a;
  }
  operator_delete(plVar4,local_58[0] + 1);
LAB_0021205a:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void ValidationState_t::RegisterDebugInstruction(const Instruction* inst) {
  switch (inst->opcode()) {
    case spv::Op::OpName: {
      const auto target = inst->GetOperandAs<uint32_t>(0);
      const std::string str = inst->GetOperandAs<std::string>(1);
      AssignNameToId(target, str);
      break;
    }
    case spv::Op::OpMemberName: {
      const auto target = inst->GetOperandAs<uint32_t>(0);
      const std::string str = inst->GetOperandAs<std::string>(2);
      AssignNameToId(target, str);
      break;
    }
    case spv::Op::OpSourceContinued:
    case spv::Op::OpSource:
    case spv::Op::OpSourceExtension:
    case spv::Op::OpString:
    case spv::Op::OpLine:
    case spv::Op::OpNoLine:
    default:
      break;
  }
}